

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O3

void doMagMinMaxCal(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  RTIMUMagCal::magCalInit();
  magMinMaxDone = 0;
  puts("\n\nMagnetometer min/max calibration");
  puts("--------------------------------");
  puts("Waggle the IMU chip around, ensuring that all six axes");
  puts("(+x, -x, +y, -y and +z, -z) go through their extrema.");
  puts("When all extrema have been achieved, enter \'s\' to save, \'r\' to reset");
  puts("or \'x\' to abort and discard the data.");
  printf("\nPress any key to start...");
  getchar();
  lVar4 = RTMath::currentUSecsSinceEpoch();
  while( true ) {
    while( true ) {
      iVar3 = (**(code **)(*(long *)imu + 0x28))();
      usleep(iVar3 * 1000);
      while( true ) {
        bVar1 = pollIMU();
        if (!bVar1) break;
        RTIMUMagCal::newMinMaxData((RTVector3 *)magCal);
        lVar5 = RTMath::currentUSecsSinceEpoch();
        if (100000 < (ulong)(lVar5 - lVar4)) {
          displayMagMinMax();
          lVar4 = lVar5;
        }
      }
      cVar2 = getUserChar();
      if (cVar2 != 'r') break;
      puts("\nResetting min/max data.");
      RTIMUMagCal::magCalReset();
    }
    if (cVar2 == 'x') break;
    if (cVar2 == 's') {
      puts("\nSaving min/max data.\n");
      RTIMUMagCal::magCalSaveMinMax();
      magMinMaxDone = 1;
      return;
    }
  }
  puts("\nAborting.");
  return;
}

Assistant:

void doMagMinMaxCal()
{
    uint64_t displayTimer;
    uint64_t now;
    char input;

    magCal->magCalInit();
    magMinMaxDone = false;

    //  now collect data

    printf("\n\nMagnetometer min/max calibration\n");
    printf("--------------------------------\n");
    printf("Waggle the IMU chip around, ensuring that all six axes\n");
    printf("(+x, -x, +y, -y and +z, -z) go through their extrema.\n");
    printf("When all extrema have been achieved, enter 's' to save, 'r' to reset\n");
    printf("or 'x' to abort and discard the data.\n");
    printf("\nPress any key to start...");
    getchar();

    displayTimer = RTMath::currentUSecsSinceEpoch();

    while (1) {
        //  poll at the rate recommended by the IMU

        usleep(imu->IMUGetPollInterval() * 1000);

        while (pollIMU()) {
            magCal->newMinMaxData(imuData.compass);
            now = RTMath::currentUSecsSinceEpoch();

            //  display 10 times per second

            if ((now - displayTimer) > 100000) {
                displayMagMinMax();
                displayTimer = now;
            }
        }

        if ((input = getUserChar()) != 0) {
            switch (input) {
            case 's' :
                printf("\nSaving min/max data.\n\n");
                magCal->magCalSaveMinMax();
                magMinMaxDone = true;
                return;

            case 'x' :
                printf("\nAborting.\n");
                return;

            case 'r' :
                printf("\nResetting min/max data.\n");
                magCal->magCalReset();
                break;
            }
        }
    }
}